

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

int __thiscall
P_Alternation::match(P_Alternation *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  P_Sequence *pPVar1;
  pointer pSVar2;
  long lVar3;
  bool bVar4;
  StateP sp;
  StateP SStack_88;
  
  StateP::StateP(&SStack_88,
                 (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
  std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  lVar3 = (long)(this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back(stk,&SStack_88);
    pPVar1 = (this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
    pSVar2 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar1->parent = pSVar2[-1].seq;
    pPVar1->iparent = pSVar2[-1].iseq;
    pSVar2[-1].seq = pPVar1;
    pSVar2[-1].iseq = 0;
  }
  State::~State(&SStack_88.st);
  return 0;
}

Assistant:

int P_Alternation::match(vector<StateP> &stk) {
    StateP sp = stk.back(); stk.pop_back();

    for (size_t i = v.size(); i--; ) {
        stk.push_back(sp);
        v[i]->match(stk);
    }
    return 0;
}